

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strnid.cc
# Opt level: O0

int ASN1_STRING_TABLE_add(int param_1,long param_2,long param_3,ulong param_4,ulong param_5)

{
  int iVar1;
  ASN1_STRING_TABLE *pAVar2;
  ASN1_STRING_TABLE *local_70;
  ASN1_STRING_TABLE *old_tbl;
  ASN1_STRING_TABLE key;
  ASN1_STRING_TABLE *tbl;
  int ret;
  unsigned_long flags_local;
  unsigned_long mask_local;
  long maxsize_local;
  long minsize_local;
  int nid_local;
  
  pAVar2 = asn1_string_table_get(param_1);
  if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
    ERR_put_error(0xc,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                  ,0x99);
    return 0;
  }
  tbl._4_4_ = 0;
  CRYPTO_MUTEX_lock_write(&string_tables_lock);
  key.flags = 0;
  if (string_tables == (lhash_st_ASN1_STRING_TABLE *)0x0) {
    string_tables = lh_ASN1_STRING_TABLE_new(table_hash,table_cmp);
    if (string_tables == (lhash_st_ASN1_STRING_TABLE *)0x0) goto LAB_002c81ea;
  }
  else {
    old_tbl._0_4_ = param_1;
    pAVar2 = lh_ASN1_STRING_TABLE_retrieve(string_tables,(ASN1_STRING_TABLE *)&old_tbl);
    if (pAVar2 != (ASN1_STRING_TABLE *)0x0) {
      ERR_put_error(0xc,0,0x42,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                    ,0xac);
      goto LAB_002c81ea;
    }
  }
  key.flags = (unsigned_long)OPENSSL_malloc(0x28);
  if ((ASN1_STRING_TABLE *)key.flags != (ASN1_STRING_TABLE *)0x0) {
    ((ASN1_STRING_TABLE *)key.flags)->nid = param_1;
    ((ASN1_STRING_TABLE *)key.flags)->flags = param_5;
    ((ASN1_STRING_TABLE *)key.flags)->minsize = param_2;
    ((ASN1_STRING_TABLE *)key.flags)->maxsize = param_3;
    ((ASN1_STRING_TABLE *)key.flags)->mask = param_4;
    iVar1 = lh_ASN1_STRING_TABLE_insert(string_tables,&local_70,(ASN1_STRING_TABLE *)key.flags);
    if (iVar1 == 0) {
      OPENSSL_free((void *)key.flags);
    }
    else {
      if (local_70 != (ASN1_STRING_TABLE *)0x0) {
        __assert_fail("old_tbl == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strnid.cc"
                      ,0xc0,
                      "int ASN1_STRING_TABLE_add(int, long, long, unsigned long, unsigned long)");
      }
      tbl._4_4_ = 1;
    }
  }
LAB_002c81ea:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return tbl._4_4_;
}

Assistant:

int ASN1_STRING_TABLE_add(int nid, long minsize, long maxsize,
                          unsigned long mask, unsigned long flags) {
  // Existing entries cannot be overwritten.
  if (asn1_string_table_get(nid) != NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  int ret = 0;
  CRYPTO_MUTEX_lock_write(&string_tables_lock);

  ASN1_STRING_TABLE *tbl = NULL;
  if (string_tables == NULL) {
    string_tables = lh_ASN1_STRING_TABLE_new(table_hash, table_cmp);
    if (string_tables == NULL) {
      goto err;
    }
  } else {
    // Check again for an existing entry. One may have been added while
    // unlocked.
    ASN1_STRING_TABLE key;
    key.nid = nid;
    if (lh_ASN1_STRING_TABLE_retrieve(string_tables, &key) != NULL) {
      OPENSSL_PUT_ERROR(ASN1, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      goto err;
    }
  }

  tbl = reinterpret_cast<ASN1_STRING_TABLE *>(
      OPENSSL_malloc(sizeof(ASN1_STRING_TABLE)));
  if (tbl == NULL) {
    goto err;
  }
  tbl->nid = nid;
  tbl->flags = flags;
  tbl->minsize = minsize;
  tbl->maxsize = maxsize;
  tbl->mask = mask;
  ASN1_STRING_TABLE *old_tbl;
  if (!lh_ASN1_STRING_TABLE_insert(string_tables, &old_tbl, tbl)) {
    OPENSSL_free(tbl);
    goto err;
  }
  assert(old_tbl == NULL);
  ret = 1;

err:
  CRYPTO_MUTEX_unlock_write(&string_tables_lock);
  return ret;
}